

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O3

void BYTE_OUT1R(dill_stream s,int rex,int insn1)

{
  byte *pbVar1;
  byte bVar2;
  
  bVar2 = (byte)insn1;
  pbVar1 = (byte *)s->p->cur_ip;
  if (s->p->code_limit <= pbVar1) {
    extend_dill_stream(s);
    pbVar1 = (byte *)s->p->cur_ip;
  }
  if (rex != 0) {
    pbVar1[1] = bVar2;
    bVar2 = (byte)rex | 0x40;
  }
  *pbVar1 = bVar2;
  if (s->dill_debug != 0) {
    dump_cur_dill_insn(s);
  }
  s->p->cur_ip = s->p->cur_ip + (2 - (ulong)(rex == 0));
  return;
}

Assistant:

static void
BYTE_OUT1R(dill_stream s, int rex, int insn1)
{
    unsigned char* tmp_ip;
    if (s->p->cur_ip >= s->p->code_limit) {
        extend_dill_stream(s);
    }
    tmp_ip = (unsigned char*)s->p->cur_ip;
    if (rex != 0) {
        *tmp_ip = (unsigned char)rex | 0x40;
        *(tmp_ip + 1) = (unsigned char)insn1;
    } else {
        *(tmp_ip) = (unsigned char)insn1;
    }
    if (s->dill_debug)
        dump_cur_dill_insn(s);
    s->p->cur_ip = ((char*)s->p->cur_ip) + 1;
    if (rex != 0)
        s->p->cur_ip++;
}